

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_checkpointer.cpp
# Opt level: O1

void __thiscall duckdb::ColumnDataCheckpointer::WriteToDisk(ColumnDataCheckpointer *this)

{
  vector<bool,_true> *this_00;
  ColumnCheckpointState *pCVar1;
  ColumnData *pCVar2;
  DatabaseInstance *pDVar3;
  RowGroup *pRVar4;
  ColumnCheckpointInfo *pCVar5;
  compression_init_compression_t p_Var6;
  _Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_> _Var7;
  _Head_base<0UL,_duckdb::CompressionState_*,_false> _Var8;
  compression_compress_finalize_t p_Var9;
  undefined8 uVar10;
  bool bVar11;
  reference pvVar12;
  DBConfig *this_01;
  optional_ptr<duckdb::CompressionFunction,_true> oVar13;
  reference pvVar14;
  reference pvVar15;
  reference pvVar16;
  unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true> uVar17;
  reference pvVar18;
  type pCVar19;
  size_type sVar20;
  reference rVar21;
  vector<duckdb::CheckpointAnalyzeResult,_true> analyze_result;
  vector<duckdb::unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>,_true>
  compression_states;
  vector<duckdb::ColumnDataCheckpointData,_true> checkpoint_data;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  ColumnDataCheckpointer *local_98;
  vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_> local_90
  ;
  vector<bool,_true> *local_78;
  reference local_70;
  size_type local_68;
  vector<duckdb::unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>_>_>
  local_60;
  vector<duckdb::ColumnDataCheckpointData,_std::allocator<duckdb::ColumnDataCheckpointData>_>
  local_48;
  
  DropSegments(this);
  DetectBestCompressionMethod((vector<duckdb::CheckpointAnalyzeResult,_true> *)&local_90,this);
  bVar11 = ValidityCoveredByBasedata
                     (this,(vector<duckdb::CheckpointAnalyzeResult,_true> *)&local_90);
  if (bVar11) {
    pvVar12 = vector<duckdb::CheckpointAnalyzeResult,_true>::operator[]
                        ((vector<duckdb::CheckpointAnalyzeResult,_true> *)&local_90,1);
    this_01 = DBConfig::GetConfig(this->db);
    oVar13 = DBConfig::GetCompressionFunction(this_01,COMPRESSION_EMPTY,BIT);
    (pvVar12->function).ptr = oVar13.ptr;
  }
  ::std::vector<duckdb::ColumnDataCheckpointData,_std::allocator<duckdb::ColumnDataCheckpointData>_>
  ::vector(&local_48,
           (long)(this->checkpoint_states->
                 super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                 ).
                 super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->checkpoint_states->
                 super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                 ).
                 super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,
           (allocator_type *)local_b8._M_pod_data);
  ::std::
  vector<duckdb::unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>_>_>
  ::vector(&local_60,
           (long)(this->checkpoint_states->
                 super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                 ).
                 super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->checkpoint_states->
                 super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                 ).
                 super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,
           (allocator_type *)local_b8._M_pod_data);
  local_98 = this;
  if (local_90.
      super__Vector_base<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_90.
      super__Vector_base<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_78 = &this->has_changes;
    sVar20 = 0;
    do {
      rVar21 = vector<bool,_true>::get<true>(local_78,sVar20);
      if ((*rVar21._M_p & rVar21._M_mask) != 0) {
        pvVar12 = vector<duckdb::CheckpointAnalyzeResult,_true>::operator[]
                            ((vector<duckdb::CheckpointAnalyzeResult,_true> *)&local_90,sVar20);
        pvVar14 = vector<duckdb::CheckpointAnalyzeResult,_true>::operator[]
                            ((vector<duckdb::CheckpointAnalyzeResult,_true> *)&local_90,sVar20);
        local_70 = pvVar12;
        pvVar15 = vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_true>::operator[]
                            (this->checkpoint_states,sVar20);
        pCVar1 = pvVar15->_M_data;
        pCVar2 = pCVar1->column_data;
        pDVar3 = pCVar2->info->db->db;
        pRVar4 = this->row_group;
        pCVar5 = this->checkpoint_info;
        local_68 = sVar20;
        pvVar16 = vector<duckdb::ColumnDataCheckpointData,_true>::operator[]
                            ((vector<duckdb::ColumnDataCheckpointData,_true> *)&local_48,sVar20);
        (pvVar16->checkpoint_state).ptr = pCVar1;
        (pvVar16->col_data).ptr = pCVar2;
        (pvVar16->db).ptr = pDVar3;
        (pvVar16->row_group).ptr = pRVar4;
        (pvVar16->checkpoint_info).ptr = pCVar5;
        optional_ptr<duckdb::CompressionFunction,_true>::CheckValid(&pvVar14->function);
        sVar20 = local_68;
        p_Var6 = ((pvVar14->function).ptr)->init_compression;
        uVar17.super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>.
        _M_t.super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>.
        super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl =
             (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
             vector<duckdb::ColumnDataCheckpointData,_true>::operator[]
                       ((vector<duckdb::ColumnDataCheckpointData,_true> *)&local_48,local_68);
        _Var7.super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl =
             (local_70->analyze_state).
             super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>
             .super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>;
        (local_70->analyze_state).
        super_unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t.
        super___uniq_ptr_impl<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::AnalyzeState_*,_std::default_delete<duckdb::AnalyzeState>_>.
        super__Head_base<0UL,_duckdb::AnalyzeState_*,_false> =
             (_Head_base<0UL,_duckdb::AnalyzeState_*,_false>)0x0;
        (*p_Var6)((ColumnDataCheckpointData *)&local_b8,uVar17);
        this = local_98;
        pvVar18 = vector<duckdb::unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>,_true>
                                *)&local_60,sVar20);
        uVar10 = local_b8._M_unused._0_8_;
        local_b8._M_unused._M_object = (long *)0x0;
        _Var8._M_head_impl =
             (pvVar18->
             super_unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::CompressionState_*,_std::default_delete<duckdb::CompressionState>_>
             .super__Head_base<0UL,_duckdb::CompressionState_*,_false>._M_head_impl;
        (pvVar18->
        super_unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::CompressionState_*,_std::default_delete<duckdb::CompressionState>_>
        .super__Head_base<0UL,_duckdb::CompressionState_*,_false>._M_head_impl =
             (CompressionState *)uVar10;
        if (_Var8._M_head_impl != (CompressionState *)0x0) {
          (**(code **)((long)(_Var8._M_head_impl)->_vptr_CompressionState + 8))();
        }
        if ((long *)local_b8._M_unused._0_8_ != (long *)0x0) {
          (**(code **)(*local_b8._M_unused._M_object + 8))();
        }
        local_b8._M_unused._M_object = (CompressionState *)0x0;
        if (_Var7.super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>._M_head_impl !=
            (AnalyzeState *)0x0) {
          (**(code **)(*(long *)_Var7.super__Head_base<0UL,_duckdb::AnalyzeState_*,_false>.
                                _M_head_impl + 8))();
        }
      }
      sVar20 = sVar20 + 1;
    } while (sVar20 < (ulong)((long)local_90.
                                    super__Vector_base<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_90.
                                    super__Vector_base<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = operator_new(0x18);
  *(ColumnDataCheckpointer **)local_b8._M_unused._0_8_ = this;
  *(vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_> **)
   ((long)local_b8._M_unused._0_8_ + 8) = &local_90;
  *(vector<duckdb::unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>_>_>
    **)((long)local_b8._M_unused._0_8_ + 0x10) = &local_60;
  pcStack_a0 = ::std::
               _Function_handler<void_(duckdb::Vector_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/table/column_data_checkpointer.cpp:330:15)>
               ::_M_invoke;
  local_a8 = ::std::
             _Function_handler<void_(duckdb::Vector_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/table/column_data_checkpointer.cpp:330:15)>
             ::_M_manager;
  ScanSegments(this,(function<void_(duckdb::Vector_&,_unsigned_long)> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if ((this->checkpoint_states->
      super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->checkpoint_states->
      super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &local_98->has_changes;
    sVar20 = 0;
    do {
      rVar21 = vector<bool,_true>::get<true>(this_00,sVar20);
      if ((*rVar21._M_p & rVar21._M_mask) != 0) {
        pvVar12 = vector<duckdb::CheckpointAnalyzeResult,_true>::operator[]
                            ((vector<duckdb::CheckpointAnalyzeResult,_true> *)&local_90,sVar20);
        pvVar18 = vector<duckdb::unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>,_true>
                                *)&local_60,sVar20);
        optional_ptr<duckdb::CompressionFunction,_true>::CheckValid(&pvVar12->function);
        p_Var9 = ((pvVar12->function).ptr)->compress_finalize;
        pCVar19 = unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>
                  ::operator*(pvVar18);
        (*p_Var9)(pCVar19);
      }
      sVar20 = sVar20 + 1;
    } while (sVar20 < (ulong)((long)(local_98->checkpoint_states->
                                    super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                    ).
                                    super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_98->checkpoint_states->
                                    super_vector<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                    ).
                                    super__Vector_base<std::reference_wrapper<duckdb::ColumnCheckpointState>,_std::allocator<std::reference_wrapper<duckdb::ColumnCheckpointState>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressionState,_std::default_delete<duckdb::CompressionState>,_true>_>_>
  ::~vector(&local_60);
  if (local_48.
      super__Vector_base<duckdb::ColumnDataCheckpointData,_std::allocator<duckdb::ColumnDataCheckpointData>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<duckdb::ColumnDataCheckpointData,_std::allocator<duckdb::ColumnDataCheckpointData>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::CheckpointAnalyzeResult,_std::allocator<duckdb::CheckpointAnalyzeResult>_>::
  ~vector(&local_90);
  return;
}

Assistant:

void ColumnDataCheckpointer::WriteToDisk() {
	DropSegments();

	// Analyze the candidate functions to select one of them to use for compression
	auto analyze_result = DetectBestCompressionMethod();
	if (ValidityCoveredByBasedata(analyze_result)) {
		D_ASSERT(analyze_result.size() == 2);
		auto &validity = analyze_result[1];
		auto &config = DBConfig::GetConfig(db);
		// Override the function to the COMPRESSION_EMPTY
		// turning the compression+final compress steps into a no-op, saving a single empty segment
		validity.function = config.GetCompressionFunction(CompressionType::COMPRESSION_EMPTY, PhysicalType::BIT);
	}

	// Initialize the compression for the selected function
	D_ASSERT(analyze_result.size() == checkpoint_states.size());
	vector<ColumnDataCheckpointData> checkpoint_data(checkpoint_states.size());
	vector<unique_ptr<CompressionState>> compression_states(checkpoint_states.size());
	for (idx_t i = 0; i < analyze_result.size(); i++) {
		if (!has_changes[i]) {
			continue;
		}
		auto &analyze_state = analyze_result[i].analyze_state;
		auto &function = analyze_result[i].function;

		auto &checkpoint_state = checkpoint_states[i];
		auto &col_data = checkpoint_state.get().column_data;

		checkpoint_data[i] =
		    ColumnDataCheckpointData(checkpoint_state, col_data, col_data.GetDatabase(), row_group, checkpoint_info);
		compression_states[i] = function->init_compression(checkpoint_data[i], std::move(analyze_state));
	}

	// Scan over the existing segment + changes and compress the data
	ScanSegments([&](Vector &scan_vector, idx_t count) {
		for (idx_t i = 0; i < checkpoint_states.size(); i++) {
			if (!has_changes[i]) {
				continue;
			}
			auto &function = analyze_result[i].function;
			auto &compression_state = compression_states[i];
			function->compress(*compression_state, scan_vector, count);
		}
	});

	// Finalize the compression
	for (idx_t i = 0; i < checkpoint_states.size(); i++) {
		if (!has_changes[i]) {
			continue;
		}
		auto &function = analyze_result[i].function;
		auto &compression_state = compression_states[i];
		function->compress_finalize(*compression_state);
	}
}